

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O0

Vec_Ptr_t * Gia_ManCollapse(Gia_Man_t *p,DdManager *dd,int nBddLimit,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  DdNode *pDVar4;
  Gia_Obj_t *pGVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  int local_58;
  int local_54;
  int Id;
  int i;
  Gia_Obj_t *pObj;
  DdNode *bFunc;
  DdNode *bFunc1;
  DdNode *bFunc0;
  Vec_Ptr_t *vFuncs;
  int fVerbose_local;
  int nBddLimit_local;
  DdManager *dd_local;
  Gia_Man_t *p_local;
  
  Gia_ManCreateRefs(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_PtrStart(iVar1);
  iVar1 = Gia_ObjRefNumId(p,0);
  if (0 < iVar1) {
    pDVar4 = Cudd_ReadLogicZero(dd);
    Vec_PtrWriteEntry(p_00,0,pDVar4);
    pDVar4 = Cudd_ReadLogicZero(dd);
    Cudd_Ref(pDVar4);
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar8 = false;
    if (local_54 < iVar1) {
      pGVar5 = Gia_ManCi(p,local_54);
      local_58 = Gia_ObjId(p,pGVar5);
      bVar8 = local_58 != 0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjRefNumId(p,local_58);
    if (0 < iVar1) {
      pDVar4 = Cudd_bddIthVar(dd,local_54);
      Vec_PtrWriteEntry(p_00,local_58,pDVar4);
      pDVar4 = Cudd_bddIthVar(dd,local_54);
      Cudd_Ref(pDVar4);
    }
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    bVar8 = false;
    if (local_54 < p->nObjs) {
      _Id = Gia_ManObj(p,local_54);
      bVar8 = _Id != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjIsAnd(_Id);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(_Id,local_54);
      pvVar7 = Vec_PtrEntry(p_00,iVar1);
      iVar1 = Gia_ObjFaninC0(_Id);
      iVar2 = Gia_ObjFaninId1(_Id,local_54);
      pvVar6 = Vec_PtrEntry(p_00,iVar2);
      iVar2 = Gia_ObjFaninC1(_Id);
      pDVar4 = Cudd_bddAndLimit(dd,(DdNode *)((ulong)pvVar7 ^ (long)iVar1),
                                (DdNode *)((ulong)pvVar6 ^ (long)iVar2),nBddLimit);
      if (pDVar4 == (DdNode *)0x0) {
        Gia_ManCollapseDeref(dd,p_00);
        return (Vec_Ptr_t *)0x0;
      }
      Cudd_Ref(pDVar4);
      Vec_PtrWriteEntry(p_00,local_54,pDVar4);
      iVar1 = Gia_ObjFaninId0(_Id,local_54);
      Gia_ObjCollapseDeref(p,dd,p_00,iVar1);
      iVar1 = Gia_ObjFaninId1(_Id,local_54);
      Gia_ObjCollapseDeref(p,dd,p_00,iVar1);
    }
    local_54 = local_54 + 1;
  }
  local_54 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_54 < iVar1) {
      pGVar5 = Gia_ManCo(p,local_54);
      local_58 = Gia_ObjId(p,pGVar5);
      bVar8 = local_58 != 0;
    }
    if (!bVar8) break;
    pGVar5 = Gia_ManCo(p,local_54);
    iVar1 = Gia_ObjFaninId0(pGVar5,local_58);
    pvVar7 = Vec_PtrEntry(p_00,iVar1);
    iVar1 = Gia_ObjFaninC0(pGVar5);
    Vec_PtrWriteEntry(p_00,local_58,(DdNode *)((ulong)pvVar7 ^ (long)iVar1));
    Cudd_Ref((DdNode *)((ulong)pvVar7 ^ (long)iVar1));
    iVar1 = Gia_ObjFaninId0(pGVar5,local_58);
    Gia_ObjCollapseDeref(p,dd,p_00,iVar1);
    local_54 = local_54 + 1;
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Vec_PtrCountZero(p_00);
  iVar3 = Gia_ManCoNum(p);
  if (iVar1 == iVar2 + iVar3) {
    local_54 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar8 = false;
      if (local_54 < iVar1) {
        pGVar5 = Gia_ManCo(p,local_54);
        local_58 = Gia_ObjId(p,pGVar5);
        bVar8 = local_58 != 0;
      }
      if (!bVar8) break;
      pvVar7 = Vec_PtrEntry(p_00,local_58);
      Vec_PtrWriteEntry(p_00,local_54,pvVar7);
      local_54 = local_54 + 1;
    }
    iVar1 = Gia_ManCoNum(p);
    Vec_PtrShrink(p_00,iVar1);
    return p_00;
  }
  __assert_fail("Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaClp.c"
                ,0x14c,"Vec_Ptr_t *Gia_ManCollapse(Gia_Man_t *, DdManager *, int, int)");
}

Assistant:

Vec_Ptr_t * Gia_ManCollapse( Gia_Man_t * p, DdManager * dd, int nBddLimit, int fVerbose )
{
    Vec_Ptr_t * vFuncs;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Gia_Obj_t * pObj;
    int i, Id;
    Gia_ManCreateRefs( p );
    // assign constant node
    vFuncs = Vec_PtrStart( Gia_ManObjNum(p) );
    if ( Gia_ObjRefNumId(p, 0) > 0 )
        Vec_PtrWriteEntry( vFuncs, 0, Cudd_ReadLogicZero(dd) ), Cudd_Ref(Cudd_ReadLogicZero(dd));
    // assign elementary variables
    Gia_ManForEachCiId( p, Id, i )
        if ( Gia_ObjRefNumId(p, Id) > 0 )
            Vec_PtrWriteEntry( vFuncs, Id, Cudd_bddIthVar(dd,i) ), Cudd_Ref(Cudd_bddIthVar(dd,i));
    // create BDD for AND nodes
    Gia_ManForEachAnd( p, pObj, i )
    {
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, i)), Gia_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId1(pObj, i)), Gia_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddLimit );  
        if ( bFunc == NULL )
        {
            Gia_ManCollapseDeref( dd, vFuncs );
            return NULL;
        }        
        Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vFuncs, i, bFunc );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, i) );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId1(pObj, i) );
    }
    // create BDD for outputs
    Gia_ManForEachCoId( p, Id, i )
    {
        pObj = Gia_ManCo( p, i );
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
        Vec_PtrWriteEntry( vFuncs, Id, bFunc0 ); Cudd_Ref( bFunc0 );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, Id) );
    }
    assert( Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p) );
    // compact
    Gia_ManForEachCoId( p, Id, i )
        Vec_PtrWriteEntry( vFuncs, i, Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrShrink( vFuncs, Gia_ManCoNum(p) );
    return vFuncs;
}